

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O0

void bal::Cnf::print_clause(ostream *stream,uint32_t *p_clause,char *final_token)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  literal_t local_38;
  int local_34;
  literal_t local_30;
  int i_1;
  literal_t literal;
  int i;
  uint16_t clause_bitmap;
  clause_size_t literals_size;
  uint16_t clauses_bitmap;
  char *final_token_local;
  uint32_t *p_clause_local;
  ostream *stream_local;
  
  i._2_2_ = (ushort)(*p_clause >> 0x10);
  uVar1 = *p_clause;
  if (((ushort)uVar1 < 5) && (i._2_2_ != 0)) {
    literal.id_._2_2_ = 0;
    for (; i._2_2_ != 0; i._2_2_ = (ushort)((int)(uint)i._2_2_ >> 1)) {
      if ((i._2_2_ & 1) != 0) {
        for (i_1 = 0; i_1 < (int)(uVar1 & 0xffff); i_1 = i_1 + 1) {
          literal_t::literal_t(&local_30,p_clause[(long)i_1 + 1]);
          literal_t::negate(&local_30,((uint)literal.id_._2_2_ & 1 << ((byte)i_1 & 0x1f)) == 0);
          pcVar3 = "";
          if (0 < i_1) {
            pcVar3 = " ";
          }
          poVar2 = std::operator<<(stream,pcVar3);
          operator<<(poVar2,&local_30);
        }
        if (final_token != (char *)0x0) {
          std::operator<<(stream,final_token);
        }
      }
      literal.id_._2_2_ = literal.id_._2_2_ + 1;
    }
  }
  else {
    for (local_34 = 0; local_34 < (int)(uVar1 & 0xffff); local_34 = local_34 + 1) {
      pcVar3 = "";
      if (0 < local_34) {
        pcVar3 = " ";
      }
      poVar2 = std::operator<<(stream,pcVar3);
      literal_t::literal_t(&local_38,p_clause[(long)local_34 + 1]);
      operator<<(poVar2,&local_38);
    }
    if (final_token != (char *)0x0) {
      std::operator<<(stream,final_token);
    }
  }
  return;
}

Assistant:

inline static void print_clause(std::ostream& stream, const uint32_t* const p_clause, const char* final_token = nullptr) {
            uint16_t clauses_bitmap = *p_clause >> 16;
            const clause_size_t literals_size = (*p_clause & 0xFFFF);
            
            if (literals_size <= 4 && clauses_bitmap != 0) {
                uint16_t clause_bitmap = 0;
                while (clauses_bitmap > 0) {
                    if (clauses_bitmap & 1) {
                        for (auto i = 0; i < literals_size; i++) {
                            literal_t literal(*(p_clause + i + 1));
                            literal.negate((clause_bitmap & (1 << i)) == 0);
                            stream << ((i > 0) ? " " : "") << literal;
                        };
                        
                        if (final_token != nullptr) {
                            stream << final_token;
                        };
                    };
                    clause_bitmap++;
                    clauses_bitmap >>= 1;
                };
            } else {
                for (auto i = 0; i < literals_size; i++) {
                    stream << ((i > 0) ? " " : "") << literal_t(*(p_clause + i + 1));
                };
                
                if (final_token != nullptr) {
                    stream << final_token;
                };
            };
        }